

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int report_connect(socket_server *ss,socket *s,socket_message *result)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  sockaddr_all *local_68;
  void *sin_addr;
  undefined1 local_50 [4];
  socklen_t slen;
  sockaddr_all u;
  int code;
  socklen_t len;
  int error;
  socket_message *result_local;
  socket *s_local;
  socket_server *ss_local;
  
  u.v6.sin6_scope_id = 4;
  _len = result;
  result_local = (socket_message *)s;
  s_local = (socket *)ss;
  u._20_4_ = getsockopt(s->fd,1,4,&code,&u.v6.sin6_scope_id);
  if (((int)u._20_4_ < 0) || (code != 0)) {
    force_close((socket_server *)s_local,(socket *)result_local,_len);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _len->data = pcVar3;
    ss_local._4_4_ = 4;
  }
  else {
    *(undefined2 *)((long)&result_local[1].data + 2) = 5;
    _len->opaque = *(uintptr_t *)result_local;
    _len->id = *(int *)&result_local[1].field_0x14;
    _len->ud = 0;
    iVar1 = send_buffer_empty((socket *)result_local);
    if (iVar1 != 0) {
      sp_write(*(int *)((long)&(s_local->high).head + 4),result_local[1].ud,result_local,false);
    }
    sin_addr._4_4_ = 0x1c;
    iVar1 = getpeername(result_local[1].ud,(sockaddr *)local_50,(socklen_t *)((long)&sin_addr + 4));
    if (iVar1 == 0) {
      if (local_50._0_2_ == 2) {
        local_68 = (sockaddr_all *)&slen;
      }
      else {
        local_68 = &u;
      }
      pcVar3 = inet_ntop((uint)(ushort)local_50._0_2_,local_68,(char *)&s_local[0x1000d].wb_size,
                         0x80);
      if (pcVar3 != (char *)0x0) {
        _len->data = (char *)&s_local[0x1000d].wb_size;
        return 2;
      }
    }
    _len->data = (char *)0x0;
    ss_local._4_4_ = 2;
  }
  return ss_local._4_4_;
}

Assistant:

static int
report_connect(struct socket_server *ss, struct socket *s, struct socket_message *result) {
	int error;
	socklen_t len = sizeof(error);  
	int code = getsockopt(s->fd, SOL_SOCKET, SO_ERROR, &error, &len);  
	if (code < 0 || error) {  
		force_close(ss,s, result);
		result->data = strerror(errno);
		return SOCKET_ERROR;
	} else {
		s->type = SOCKET_TYPE_CONNECTED;
		result->opaque = s->opaque;
		result->id = s->id;
		result->ud = 0;
		if (send_buffer_empty(s)) {
			sp_write(ss->event_fd, s->fd, s, false);
		}
		union sockaddr_all u;
		socklen_t slen = sizeof(u);
		if (getpeername(s->fd, &u.s, &slen) == 0) {
			void * sin_addr = (u.s.sa_family == AF_INET) ? (void*)&u.v4.sin_addr : (void *)&u.v6.sin6_addr;
			if (inet_ntop(u.s.sa_family, sin_addr, ss->buffer, sizeof(ss->buffer))) {
				result->data = ss->buffer;
				return SOCKET_OPEN;
			}
		}
		result->data = NULL;
		return SOCKET_OPEN;
	}
}